

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBMultiplyRow_SSE2(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  do {
    auVar36 = *(undefined1 (*) [16])src_argb0;
    src_argb0 = (uint8_t *)((long)src_argb0 + 0x10);
    auVar38 = *(undefined1 (*) [16])src_argb1;
    src_argb1 = (uint8_t *)((long)src_argb1 + 0x10);
    auVar35._0_14_ = auVar36._0_14_;
    auVar35[0xe] = auVar36[7];
    auVar35[0xf] = auVar36[7];
    auVar34._14_2_ = auVar35._14_2_;
    auVar34._0_13_ = auVar36._0_13_;
    auVar34[0xd] = auVar36[6];
    auVar33._13_3_ = auVar34._13_3_;
    auVar33._0_12_ = auVar36._0_12_;
    auVar33[0xc] = auVar36[6];
    auVar32._12_4_ = auVar33._12_4_;
    auVar32._0_11_ = auVar36._0_11_;
    auVar32[0xb] = auVar36[5];
    auVar31._11_5_ = auVar32._11_5_;
    auVar31._0_10_ = auVar36._0_10_;
    auVar31[10] = auVar36[5];
    auVar30._10_6_ = auVar31._10_6_;
    auVar30._0_9_ = auVar36._0_9_;
    auVar30[9] = auVar36[4];
    auVar29._9_7_ = auVar30._9_7_;
    auVar29._0_8_ = auVar36._0_8_;
    auVar29[8] = auVar36[4];
    auVar28._8_8_ = auVar29._8_8_;
    auVar28[7] = auVar36[3];
    auVar28[6] = auVar36[3];
    auVar28[5] = auVar36[2];
    auVar28[4] = auVar36[2];
    auVar28[3] = auVar36[1];
    auVar28[2] = auVar36[1];
    auVar28[0] = auVar36[0];
    auVar28[1] = auVar28[0];
    auVar37[1] = auVar36[8];
    auVar37[0] = auVar36[8];
    auVar37[2] = auVar36[9];
    auVar37[3] = auVar36[9];
    auVar37[4] = auVar36[10];
    auVar37[5] = auVar36[10];
    auVar37[6] = auVar36[0xb];
    auVar37[7] = auVar36[0xb];
    auVar37[8] = auVar36[0xc];
    auVar37[9] = auVar36[0xc];
    auVar37[10] = auVar36[0xd];
    auVar37[0xb] = auVar36[0xd];
    auVar37[0xc] = auVar36[0xe];
    auVar37[0xd] = auVar36[0xe];
    auVar37[0xf] = auVar36[0xf];
    auVar37[0xe] = auVar37[0xf];
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar38._0_13_;
    auVar18[0xe] = auVar38[7];
    auVar19[0xc] = auVar38[6];
    auVar19._0_12_ = auVar38._0_12_;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar38._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    auVar21[10] = auVar38[5];
    auVar21._0_10_ = auVar38._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar38._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    auVar23[8] = auVar38[4];
    auVar23._0_8_ = auVar38._0_8_;
    auVar23._9_6_ = auVar22._9_6_;
    auVar24._7_8_ = 0;
    auVar24._0_7_ = auVar23._8_7_;
    auVar25._1_8_ = SUB158(auVar24 << 0x40,7);
    auVar25[0] = auVar38[3];
    auVar25._9_6_ = 0;
    auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
    auVar26[0] = auVar38[2];
    auVar26._11_4_ = 0;
    auVar36._3_12_ = SUB1512(auVar26 << 0x20,3);
    auVar36[2] = auVar38[1];
    auVar36[0] = auVar38[0];
    auVar36[1] = 0;
    auVar36[0xf] = 0;
    auVar39[1] = 0;
    auVar39[0] = auVar38[8];
    auVar39[2] = auVar38[9];
    auVar39[3] = 0;
    auVar39[4] = auVar38[10];
    auVar39[5] = 0;
    auVar39[6] = auVar38[0xb];
    auVar39[7] = 0;
    auVar39[8] = auVar38[0xc];
    auVar39[9] = 0;
    auVar39[10] = auVar38[0xd];
    auVar39[0xb] = 0;
    auVar39[0xc] = auVar38[0xe];
    auVar39[0xd] = 0;
    auVar39[0xe] = auVar38[0xf];
    auVar39[0xf] = 0;
    auVar36 = pmulhuw(auVar28,auVar36);
    auVar38 = pmulhuw(auVar37,auVar39);
    sVar2 = auVar36._0_2_;
    sVar3 = auVar36._2_2_;
    sVar4 = auVar36._4_2_;
    sVar5 = auVar36._6_2_;
    sVar6 = auVar36._8_2_;
    sVar7 = auVar36._10_2_;
    sVar8 = auVar36._12_2_;
    sVar9 = auVar36._14_2_;
    sVar10 = auVar38._0_2_;
    sVar11 = auVar38._2_2_;
    sVar12 = auVar38._4_2_;
    sVar13 = auVar38._6_2_;
    sVar14 = auVar38._8_2_;
    sVar15 = auVar38._10_2_;
    sVar16 = auVar38._12_2_;
    sVar17 = auVar38._14_2_;
    *dst_argb = (0 < sVar2) * (sVar2 < 0x100) * auVar36[0] - (0xff < sVar2);
    dst_argb[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar36[2] - (0xff < sVar3);
    dst_argb[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar36[4] - (0xff < sVar4);
    dst_argb[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar36[6] - (0xff < sVar5);
    dst_argb[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar36[8] - (0xff < sVar6);
    dst_argb[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar36[10] - (0xff < sVar7);
    dst_argb[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar36[0xc] - (0xff < sVar8);
    dst_argb[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar36[0xe] - (0xff < sVar9);
    dst_argb[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar38[0] - (0xff < sVar10);
    dst_argb[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar38[2] - (0xff < sVar11);
    dst_argb[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar38[4] - (0xff < sVar12);
    dst_argb[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar38[6] - (0xff < sVar13);
    dst_argb[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar38[8] - (0xff < sVar14);
    dst_argb[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar38[10] - (0xff < sVar15);
    dst_argb[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar38[0xc] - (0xff < sVar16);
    dst_argb[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar38[0xe] - (0xff < sVar17);
    dst_argb = dst_argb + 0x10;
    iVar27 = width + -4;
    bVar1 = 3 < width;
    width = iVar27;
  } while (iVar27 != 0 && bVar1);
  return;
}

Assistant:

void ARGBMultiplyRow_SSE2(const uint8_t* src_argb0,
                          const uint8_t* src_argb1,
                          uint8_t* dst_argb,
                          int width) {
  asm volatile(

      "pxor        %%xmm5,%%xmm5                 \n"

      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "lea         0x10(%0),%0                   \n"
      "movdqu      (%1),%%xmm2                   \n"
      "lea         0x10(%1),%1                   \n"
      "movdqu      %%xmm0,%%xmm1                 \n"
      "movdqu      %%xmm2,%%xmm3                 \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "punpckhbw   %%xmm1,%%xmm1                 \n"
      "punpcklbw   %%xmm5,%%xmm2                 \n"
      "punpckhbw   %%xmm5,%%xmm3                 \n"
      "pmulhuw     %%xmm2,%%xmm0                 \n"
      "pmulhuw     %%xmm3,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb0),  // %0
        "+r"(src_argb1),  // %1
        "+r"(dst_argb),   // %2
        "+r"(width)       // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}